

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

int uv_write2(uv_write_t *req,uv_stream_t *stream,uv_buf_t *bufs,uint nbufs,uv_stream_t *send_handle
             ,uv_write_cb cb)

{
  size_t sVar1;
  uv_buf_t *puVar2;
  size_t sVar3;
  int err;
  int empty_queue;
  uv_write_cb cb_local;
  uv_stream_t *send_handle_local;
  uint nbufs_local;
  uv_buf_t *bufs_local;
  uv_stream_t *stream_local;
  uv_write_t *req_local;
  
  req_local._4_4_ = uv__check_before_write(stream,nbufs,send_handle);
  if (-1 < req_local._4_4_) {
    sVar1 = stream->write_queue_size;
    req->type = UV_WRITE;
    (stream->loop->active_reqs).count = (stream->loop->active_reqs).count + 1;
    req->cb = cb;
    req->handle = stream;
    req->error = 0;
    req->send_handle = send_handle;
    uv__queue_init(&req->queue);
    req->bufs = req->bufsml;
    if (4 < nbufs) {
      puVar2 = (uv_buf_t *)uv__malloc((ulong)nbufs << 4);
      req->bufs = puVar2;
    }
    if (req->bufs == (uv_buf_t *)0x0) {
      req_local._4_4_ = -0xc;
    }
    else {
      memcpy(req->bufs,bufs,(ulong)nbufs << 4);
      req->nbufs = nbufs;
      req->write_index = 0;
      sVar3 = uv__count_bufs(bufs,nbufs);
      stream->write_queue_size = sVar3 + stream->write_queue_size;
      uv__queue_insert_tail(&stream->write_queue,&req->queue);
      if (stream->connect_req == (uv_connect_t *)0x0) {
        if (sVar1 == 0) {
          uv__write(stream);
        }
        else {
          if ((stream->flags & 0x100000) != 0) {
            __assert_fail("!(stream->flags & UV_HANDLE_BLOCKING_WRITES)",
                          "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/stream.c"
                          ,0x56c,
                          "int uv_write2(uv_write_t *, uv_stream_t *, const uv_buf_t *, unsigned int, uv_stream_t *, uv_write_cb)"
                         );
          }
          uv__io_start(stream->loop,&stream->io_watcher,4);
          uv__stream_osx_interrupt_select(stream);
        }
      }
      req_local._4_4_ = 0;
    }
  }
  return req_local._4_4_;
}

Assistant:

int uv_write2(uv_write_t* req,
              uv_stream_t* stream,
              const uv_buf_t bufs[],
              unsigned int nbufs,
              uv_stream_t* send_handle,
              uv_write_cb cb) {
  int empty_queue;
  int err;

  err = uv__check_before_write(stream, nbufs, send_handle);
  if (err < 0)
    return err;

  /* It's legal for write_queue_size > 0 even when the write_queue is empty;
   * it means there are error-state requests in the write_completed_queue that
   * will touch up write_queue_size later, see also uv__write_req_finish().
   * We could check that write_queue is empty instead but that implies making
   * a write() syscall when we know that the handle is in error mode.
   */
  empty_queue = (stream->write_queue_size == 0);

  /* Initialize the req */
  uv__req_init(stream->loop, req, UV_WRITE);
  req->cb = cb;
  req->handle = stream;
  req->error = 0;
  req->send_handle = send_handle;
  uv__queue_init(&req->queue);

  req->bufs = req->bufsml;
  if (nbufs > ARRAY_SIZE(req->bufsml))
    req->bufs = uv__malloc(nbufs * sizeof(bufs[0]));

  if (req->bufs == NULL)
    return UV_ENOMEM;

  memcpy(req->bufs, bufs, nbufs * sizeof(bufs[0]));
  req->nbufs = nbufs;
  req->write_index = 0;
  stream->write_queue_size += uv__count_bufs(bufs, nbufs);

  /* Append the request to write_queue. */
  uv__queue_insert_tail(&stream->write_queue, &req->queue);

  /* If the queue was empty when this function began, we should attempt to
   * do the write immediately. Otherwise start the write_watcher and wait
   * for the fd to become writable.
   */
  if (stream->connect_req) {
    /* Still connecting, do nothing. */
  }
  else if (empty_queue) {
    uv__write(stream);
  }
  else {
    /*
     * blocking streams should never have anything in the queue.
     * if this assert fires then somehow the blocking stream isn't being
     * sufficiently flushed in uv__write.
     */
    assert(!(stream->flags & UV_HANDLE_BLOCKING_WRITES));
    uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);
    uv__stream_osx_interrupt_select(stream);
  }

  return 0;
}